

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::convert_bezier_to_lines(SceneGraph *this,Ref<embree::SceneGraph::Node> *node)

{
  pointer *ppHVar1;
  Node *pNVar2;
  long *plVar3;
  value_type *pvVar4;
  Hair *pHVar5;
  long *plVar6;
  long lVar7;
  HairSetNode *this_00;
  Hair *hair;
  ulong uVar8;
  Hair *pHVar9;
  iterator iVar10;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *p;
  value_type *__x;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  *this_01;
  Hair local_60;
  Node *local_58;
  Ref<embree::SceneGraph::MaterialNode> local_50;
  Ref<embree::SceneGraph::Node> local_48;
  Ref<embree::SceneGraph::Node> local_40;
  Ref<embree::SceneGraph::Node> local_38;
  
  pNVar2 = node->ptr;
  if (pNVar2 != (Node *)0x0) {
    plVar6 = (long *)__dynamic_cast(pNVar2,&Node::typeinfo,&TransformNode::typeinfo);
    if (plVar6 == (long *)0x0) {
      plVar6 = (long *)__dynamic_cast(pNVar2,&Node::typeinfo,&MultiTransformNode::typeinfo);
      if (plVar6 == (long *)0x0) {
        plVar6 = (long *)__dynamic_cast(pNVar2,&Node::typeinfo,&GroupNode::typeinfo);
        if (plVar6 == (long *)0x0) {
          plVar6 = (long *)__dynamic_cast(pNVar2,&Node::typeinfo,&HairSetNode::typeinfo);
          if (plVar6 != (long *)0x0) {
            (**(code **)(*plVar6 + 0x10))(plVar6);
            local_58 = (Node *)plVar6;
            this_00 = (HairSetNode *)operator_new(0x118);
            local_50.ptr = (MaterialNode *)plVar6[0x21];
            if (local_50.ptr != (MaterialNode *)0x0) {
              (*((local_50.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
            }
            HairSetNode::HairSetNode
                      (this_00,RTC_GEOMETRY_TYPE_FLAT_LINEAR_CURVE,&local_50,
                       *(BBox1f *)(plVar6 + 0xd),0);
            (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
            if (local_50.ptr != (MaterialNode *)0x0) {
              (*((local_50.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
            }
            __x = (value_type *)plVar6[0xf];
            pvVar4 = (value_type *)plVar6[0x10];
            if (__x != pvVar4) {
              do {
                std::
                vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ::push_back(&this_00->positions,__x);
                __x = __x + 1;
              } while (__x != pvVar4);
            }
            pHVar9 = *(Hair **)((long)local_58 + 0xd8);
            pHVar5 = *(Hair **)((long)local_58 + 0xe0);
            if (pHVar9 != pHVar5) {
              this_01 = &this_00->hairs;
              do {
                local_60 = *pHVar9;
                iVar10._M_current =
                     (this_00->hairs).
                     super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (iVar10._M_current ==
                    (this_00->hairs).
                    super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                  ::_M_realloc_insert<embree::SceneGraph::HairSetNode::Hair>
                            (this_01,iVar10,&local_60);
                  iVar10._M_current =
                       (this_00->hairs).
                       super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                }
                else {
                  *iVar10._M_current = local_60;
                  iVar10._M_current =
                       (this_00->hairs).
                       super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 1;
                  (this_00->hairs).
                  super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                  ._M_impl.super__Vector_impl_data._M_finish = iVar10._M_current;
                }
                local_60.id = pHVar9->id;
                local_60.vertex = pHVar9->vertex + 1;
                if (iVar10._M_current ==
                    (this_00->hairs).
                    super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                  ::_M_realloc_insert<embree::SceneGraph::HairSetNode::Hair>
                            (this_01,iVar10,&local_60);
                  iVar10._M_current =
                       (this_00->hairs).
                       super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                }
                else {
                  *iVar10._M_current = local_60;
                  iVar10._M_current =
                       (this_00->hairs).
                       super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 1;
                  (this_00->hairs).
                  super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                  ._M_impl.super__Vector_impl_data._M_finish = iVar10._M_current;
                }
                local_60.id = pHVar9->id;
                local_60.vertex = pHVar9->vertex + 2;
                if (iVar10._M_current ==
                    (this_00->hairs).
                    super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                  ::_M_realloc_insert<embree::SceneGraph::HairSetNode::Hair>
                            (this_01,iVar10,&local_60);
                }
                else {
                  *iVar10._M_current = local_60;
                  ppHVar1 = &(this_00->hairs).
                             super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppHVar1 = *ppHVar1 + 1;
                }
                pHVar9 = pHVar9 + 1;
              } while (pHVar9 != pHVar5);
            }
            *(HairSetNode **)this = this_00;
            (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
            (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
            (**(code **)(*(long *)local_58 + 0x18))();
            return (Ref<embree::SceneGraph::Node>)(Node *)this;
          }
        }
        else {
          local_58 = (Node *)this;
          (**(code **)(*plVar6 + 0x10))(plVar6);
          lVar7 = plVar6[0xd];
          if (plVar6[0xe] != lVar7) {
            uVar8 = 0;
            do {
              local_48.ptr = *(Node **)(lVar7 + uVar8 * 8);
              if (local_48.ptr != (Node *)0x0) {
                (*((local_48.ptr)->super_RefCount)._vptr_RefCount[2])();
              }
              convert_bezier_to_lines((SceneGraph *)&local_60,&local_48);
              lVar7 = plVar6[0xd];
              plVar3 = *(long **)(lVar7 + uVar8 * 8);
              if (plVar3 != (long *)0x0) {
                (**(code **)(*plVar3 + 0x18))();
              }
              *(Hair *)(lVar7 + uVar8 * 8) = local_60;
              if (local_48.ptr != (Node *)0x0) {
                (*((local_48.ptr)->super_RefCount)._vptr_RefCount[3])();
              }
              uVar8 = uVar8 + 1;
              lVar7 = plVar6[0xd];
            } while (uVar8 < (ulong)(plVar6[0xe] - lVar7 >> 3));
          }
          (**(code **)(*plVar6 + 0x18))(plVar6);
          this = (SceneGraph *)local_58;
        }
      }
      else {
        (**(code **)(*plVar6 + 0x10))(plVar6);
        local_40.ptr = (Node *)plVar6[0x10];
        if (local_40.ptr != (Node *)0x0) {
          (*((local_40.ptr)->super_RefCount)._vptr_RefCount[2])();
        }
        convert_bezier_to_lines((SceneGraph *)&local_60,&local_40);
        if ((long *)plVar6[0x10] != (long *)0x0) {
          (**(code **)(*(long *)plVar6[0x10] + 0x18))();
        }
        *(Hair *)(plVar6 + 0x10) = local_60;
        if (local_40.ptr != (Node *)0x0) {
          (*((local_40.ptr)->super_RefCount)._vptr_RefCount[3])();
        }
        (**(code **)(*plVar6 + 0x18))(plVar6);
      }
    }
    else {
      (**(code **)(*plVar6 + 0x10))(plVar6);
      local_38.ptr = (Node *)plVar6[0x13];
      if (local_38.ptr != (Node *)0x0) {
        (*((local_38.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      convert_bezier_to_lines((SceneGraph *)&local_60,&local_38);
      if ((long *)plVar6[0x13] != (long *)0x0) {
        (**(code **)(*(long *)plVar6[0x13] + 0x18))();
      }
      *(Hair *)(plVar6 + 0x13) = local_60;
      if (local_38.ptr != (Node *)0x0) {
        (*((local_38.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      (**(code **)(*plVar6 + 0x18))(plVar6);
    }
  }
  (((Node *)this)->super_RefCount)._vptr_RefCount = (_func_int **)node->ptr;
  node->ptr = (Node *)0x0;
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_bezier_to_lines(Ref<SceneGraph::Node> node)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      xfmNode->child = convert_bezier_to_lines(xfmNode->child);
    }
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      xfmNode->child = convert_bezier_to_lines(xfmNode->child);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        groupNode->children[i] = convert_bezier_to_lines(groupNode->children[i]);
    }
    else if (Ref<SceneGraph::HairSetNode> hmesh = node.dynamicCast<SceneGraph::HairSetNode>()) 
    {
      Ref<SceneGraph::HairSetNode> lmesh = new SceneGraph::HairSetNode(RTC_GEOMETRY_TYPE_FLAT_LINEAR_CURVE, hmesh->material, hmesh->time_range, 0);

      for (auto& p : hmesh->positions)
        lmesh->positions.push_back(p);

      for (auto& hair : hmesh->hairs) {
        lmesh->hairs.push_back(SceneGraph::HairSetNode::Hair(hair.vertex+0,hair.id));
        lmesh->hairs.push_back(SceneGraph::HairSetNode::Hair(hair.vertex+1,hair.id));
        lmesh->hairs.push_back(SceneGraph::HairSetNode::Hair(hair.vertex+2,hair.id));
      }
      return lmesh.dynamicCast<SceneGraph::Node>();
    }
    return node;
  }